

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O1

bool jsoncons::operator<(key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
                         *lhs,key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
                              *rhs)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = std::__cxx11::
          basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>::
          compare(&lhs->key_,&rhs->key_);
  bVar2 = true;
  if (-1 < iVar1) {
    iVar1 = std::__cxx11::
            basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>::
            compare(&lhs->key_,&rhs->key_);
    if ((iVar1 == 0) &&
       (iVar1 = basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>::
                compare(&lhs->value_,&rhs->value_), iVar1 < 0)) {
      return true;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator<(const key_value& lhs, const key_value& rhs) noexcept
        {
            if (lhs.key_ < rhs.key_)
            {
                return true;
            }
            if (lhs.key_ == rhs.key_ && lhs.value_ < rhs.value_)
            {
                return true;
            }
            return false;
        }